

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O1

bool __thiscall OpenMD::SelectionCompiler::clauseWithin(SelectionCompiler *this)

{
  any *paVar1;
  int iVar2;
  bool bVar3;
  any distance;
  Token tokenDistance;
  _Arg __arg;
  Token local_80;
  any local_68;
  Token local_50;
  Token local_38;
  _Arg local_20;
  
  tokenNext(&local_38,this);
  if (local_38.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_38.value._M_manager)(_Op_destroy,&local_38.value,(_Arg *)0x0);
    local_38.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  tokenNext(&local_50,this);
  iVar2 = local_50.tok;
  if (local_50.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_50.value._M_manager)(_Op_destroy,&local_50.value,(_Arg *)0x0);
    local_50.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (iVar2 == 0x400) {
    local_68._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    local_68._M_storage._M_ptr = (void *)0x0;
    tokenNext(&local_50,this);
    if ((local_50.tok & 0xfffffffeU) == 2) {
      std::any::operator=(&local_68,&local_50.value);
      tokenNext(&local_80,this);
      iVar2 = local_80.tok;
      if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        (*local_80.value._M_manager)(_Op_destroy,&local_80.value,(_Arg *)0x0);
        local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      }
      if (iVar2 == 0x404) {
        bVar3 = clauseOr(this);
        if (bVar3) {
          tokenNext(&local_80,this);
          paVar1 = &local_80.value;
          iVar2 = local_80.tok;
          if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
            (*local_80.value._M_manager)(_Op_destroy,paVar1,(_Arg *)0x0);
            local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
          }
          if (iVar2 == 0x401) {
            local_80.tok = 0x1406;
            local_80.intValue = 0;
            local_80.value._M_storage._M_ptr = (void *)0x0;
            if (local_68._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
              local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
            }
            else {
              local_20._M_any = paVar1;
              (*local_68._M_manager)(_Op_clone,&local_68,&local_20);
            }
            std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                      (&this->ltokenPostfix,&local_80);
            if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
              (*local_80.value._M_manager)(_Op_destroy,paVar1,(_Arg *)0x0);
              local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
            }
            bVar3 = true;
          }
          else {
            bVar3 = rightParenthesisExpected(this);
          }
        }
        else {
          bVar3 = false;
        }
      }
      else {
        bVar3 = commaExpected(this);
      }
    }
    else {
      bVar3 = numberOrKeywordExpected(this);
    }
    if (local_50.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_50.value._M_manager)(_Op_destroy,&local_50.value,(_Arg *)0x0);
      local_50.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    if (local_68._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_68._M_manager)(_Op_destroy,&local_68,(_Arg *)0x0);
    }
  }
  else {
    bVar3 = leftParenthesisExpected(this);
  }
  return bVar3;
}

Assistant:

bool SelectionCompiler::clauseWithin() {
    tokenNext();                                // WITHIN
    if (tokenNext().tok != Token::leftparen) {  // (
      return leftParenthesisExpected();
    }

    std::any distance;
    Token tokenDistance = tokenNext();  // distance
    switch (tokenDistance.tok) {
    case Token::integer:
    case Token::decimal:
      distance = tokenDistance.value;
      break;
    default:
      return numberOrKeywordExpected();
    }

    if (tokenNext().tok != Token::opOr) {  // ,
      return commaExpected();
    }

    if (!clauseOr()) {  // *expression*
      return false;
    }

    if (tokenNext().tok != Token::rightparen) {  // )T
      return rightParenthesisExpected();
    }

    return addTokenToPostfix(Token(Token::within, distance));
  }